

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O0

void __thiscall pg::TSPMSolver::run(TSPMSolver *this)

{
  int node;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  ostream *poVar15;
  Error *this_00;
  char *pcVar16;
  int local_f4;
  int winner;
  int *pm;
  int local_58;
  int n_4;
  int n_3;
  int from_1;
  int *curedge_1;
  int64_t iStack_40;
  int n_2;
  int64_t last_update;
  int *piStack_30;
  int from;
  int *curedge;
  int n_1;
  int n;
  int i_3;
  int i_2;
  int i_1;
  int i;
  TSPMSolver *this_local;
  
  lVar11 = Solver::nodecount(&this->super_Solver);
  iVar9 = Solver::priority(&this->super_Solver,(int)lVar11 + -1);
  this->k = (long)(iVar9 + 1);
  if (this->k < 2) {
    this->k = 2;
  }
  lVar11 = this->k;
  lVar12 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lVar11 * lVar12;
  uVar13 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar13);
  this->pms = piVar14;
  uVar13 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar13;
  uVar13 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar13);
  this->strategy = piVar14;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->k;
  uVar13 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar13);
  this->counts = piVar14;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->k;
  uVar13 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar13);
  this->tmp = piVar14;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->k;
  uVar13 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar13);
  this->best = piVar14;
  uVar13 = Solver::nodecount(&this->super_Solver);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar13;
  uVar13 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar13);
  this->dirty = piVar14;
  uVar13 = Solver::nodecount(&this->super_Solver);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar13;
  uVar13 = SUB168(auVar7 * ZEXT816(4),0);
  if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar13);
  this->unstable = piVar14;
  for (i_2 = 0; lVar11 = this->k, lVar12 = Solver::nodecount(&this->super_Solver),
      (long)i_2 < lVar11 * lVar12; i_2 = i_2 + 1) {
    this->pms[i_2] = 0;
  }
  for (i_3 = 0; lVar11 = Solver::nodecount(&this->super_Solver), i_3 < lVar11; i_3 = i_3 + 1) {
    this->strategy[i_3] = -1;
  }
  for (n = 0; (long)n < this->k; n = n + 1) {
    this->counts[n] = 0;
  }
  for (n_1 = 0; lVar11 = Solver::nodecount(&this->super_Solver), n_1 < lVar11; n_1 = n_1 + 1) {
    bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)n_1);
    if (!bVar8) {
      piVar14 = this->counts;
      iVar9 = Solver::priority(&this->super_Solver,n_1);
      piVar14[iVar9] = piVar14[iVar9] + 1;
    }
  }
  for (curedge._4_4_ = 0; lVar11 = Solver::nodecount(&this->super_Solver), curedge._4_4_ < lVar11;
      curedge._4_4_ = curedge._4_4_ + 1) {
    this->dirty[curedge._4_4_] = 0;
  }
  this->lift_attempt = 0;
  this->lift_count = 0;
  lVar11 = Solver::nodecount(&this->super_Solver);
  curedge._0_4_ = (int)lVar11;
  while (curedge._0_4_ = (int)curedge + -1, -1 < (int)curedge) {
    bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)(int)curedge);
    if ((!bVar8) && (bVar8 = lift(this,(int)curedge,-1), bVar8)) {
      for (piStack_30 = Solver::ins(&this->super_Solver,(int)curedge); *piStack_30 != -1;
          piStack_30 = piStack_30 + 1) {
        iVar9 = *piStack_30;
        bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)iVar9);
        if ((!bVar8) && (bVar8 = lift(this,iVar9,(int)curedge), bVar8)) {
          todo_push(this,iVar9);
        }
      }
    }
  }
  poVar15 = std::operator<<((this->super_Solver).logger,"main loop now");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  iStack_40 = 0;
  while (bVar8 = std::deque<int,_std::allocator<int>_>::empty(&this->todo),
        ((bVar8 ^ 0xffU) & 1) != 0) {
    iVar9 = todo_pop(this);
    for (_n_3 = Solver::ins(&this->super_Solver,iVar9); *_n_3 != -1; _n_3 = _n_3 + 1) {
      node = *_n_3;
      bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)node);
      if ((!bVar8) && (bVar8 = lift(this,node,iVar9), bVar8)) {
        todo_push(this,node);
      }
    }
    lVar11 = Solver::nodecount(&this->super_Solver);
    if (iStack_40 + lVar11 * 10 < this->lift_count) {
      iStack_40 = this->lift_count;
      update(this,0);
      update(this,1);
    }
  }
  if (1 < (this->super_Solver).trace) {
    for (local_58 = 0; lVar11 = Solver::nodecount(&this->super_Solver), local_58 < lVar11;
        local_58 = local_58 + 1) {
      bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)local_58);
      if (!bVar8) {
        poVar15 = std::operator<<((this->super_Solver).logger,"\x1b[35m**\x1b[m \x1b[1mnode ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_58);
        poVar15 = std::operator<<(poVar15,"/");
        iVar9 = Solver::priority(&this->super_Solver,local_58);
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar9);
        iVar9 = Solver::owner(&this->super_Solver,local_58);
        pcVar16 = " (even)";
        if (iVar9 != 0) {
          pcVar16 = " (odd)";
        }
        poVar15 = std::operator<<(poVar15,pcVar16);
        std::operator<<(poVar15,"\x1b[m is");
        pm_stream(this,(this->super_Solver).logger,this->pms + this->k * (long)local_58);
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
    }
  }
  pm._4_4_ = 0;
  do {
    lVar11 = Solver::nodecount(&this->super_Solver);
    if (lVar11 <= pm._4_4_) {
      if (this->pms != (int *)0x0) {
        operator_delete__(this->pms);
      }
      if (this->strategy != (int *)0x0) {
        operator_delete__(this->strategy);
      }
      if (this->counts != (int *)0x0) {
        operator_delete__(this->counts);
      }
      if (this->tmp != (int *)0x0) {
        operator_delete__(this->tmp);
      }
      if (this->best != (int *)0x0) {
        operator_delete__(this->best);
      }
      if (this->dirty != (int *)0x0) {
        operator_delete__(this->dirty);
      }
      if (this->unstable != (int *)0x0) {
        operator_delete__(this->unstable);
      }
      poVar15 = std::operator<<((this->super_Solver).logger,"solved with ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->lift_count);
      poVar15 = std::operator<<(poVar15," lifts, ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->lift_attempt);
      poVar15 = std::operator<<(poVar15," lift attempts.");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      return;
    }
    bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)pm._4_4_);
    if (!bVar8) {
      piVar14 = this->pms + this->k * (long)pm._4_4_;
      if ((*piVar14 == -1) == (piVar14[1] == -1)) {
        this_00 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_00,"logic error",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/tspm.cpp"
                     ,0x1a1);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      iVar9 = *piVar14;
      uVar10 = Solver::owner(&this->super_Solver,pm._4_4_);
      if (uVar10 == (iVar9 != -1)) {
        local_f4 = this->strategy[pm._4_4_];
      }
      else {
        local_f4 = -1;
      }
      Solver::solve(&this->super_Solver,pm._4_4_,(uint)(iVar9 != -1),local_f4);
    }
    pm._4_4_ = pm._4_4_ + 1;
  } while( true );
}

Assistant:

void
TSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    logger << "main loop now" << std::endl;
    int64_t last_update = 0;

    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (!disabled[from] and lift(from, n)) todo_push(from);
        }
        if (last_update + 10*nodecount() < lift_count) {
            last_update = lift_count;
            update(0);
            update(1);
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif
    
    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}